

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O0

double __thiscall pobr::imgProcessing::structs::Segment::getHuMomentInvariantNo7(Segment *this)

{
  double dVar1;
  double dVar2;
  double __x;
  __type _Var3;
  __type _Var4;
  uint64_t local_88 [8];
  double local_48;
  double m10;
  uint64_t local_38;
  double local_30;
  double m01;
  uint64_t local_20;
  double local_18;
  double m00;
  Segment *this_local;
  
  local_20 = 0;
  m01 = 0.0;
  m00 = (double)this;
  local_18 = getNormalMoment(this,&local_20,(uint64_t *)&m01);
  local_38 = 0;
  m10 = 4.94065645841247e-324;
  local_30 = getNormalMoment(this,&local_38,(uint64_t *)&m10);
  local_88[7] = 1;
  local_88[6] = 0;
  local_48 = getNormalMoment(this,local_88 + 7,local_88 + 6);
  local_88[5] = 2;
  local_88[4] = 0;
  dVar1 = getCentralMoment(this,local_88 + 5,local_88 + 4,&local_18,&local_48,&local_30);
  local_88[3] = 0;
  local_88[2] = 2;
  dVar2 = getCentralMoment(this,local_88 + 3,local_88 + 2,&local_18,&local_48,&local_30);
  local_88[1] = 1;
  local_88[0] = 1;
  __x = getCentralMoment(this,local_88 + 1,local_88,&local_18,&local_48,&local_30);
  _Var3 = std::pow<double,int>(__x,2);
  _Var4 = std::pow<double,int>(local_18,4);
  return (dVar1 * dVar2 + -_Var3) / _Var4;
}

Assistant:

const double
Segment::getHuMomentInvariantNo7()
const
{
    const auto m00 = this->getNormalMoment(0, 0);
    const auto m01 = this->getNormalMoment(0, 1);
    const auto m10 = this->getNormalMoment(1, 0);

    return (
        (
            (
                this->getCentralMoment(2, 0, m00, m10, m01) *
                this->getCentralMoment(0, 2, m00, m10, m01)
            )
            -
            std::pow(
                this->getCentralMoment(1, 1, m00, m10, m01),
                2
            )
        )
        /
        std::pow(m00, 4)
    );
}